

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall testing::internal::FilePath::RemoveDirectoryName(FilePath *this)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String *in_RSI;
  FilePath FVar3;
  String local_20;
  
  pcVar1 = FindLastPathSeparator((FilePath *)in_RSI);
  if (pcVar1 == (char *)0x0) {
    String::String(&this->pathname_,in_RSI);
    sVar2 = extraout_RDX_00;
  }
  else {
    String::String(&local_20,pcVar1 + 1);
    FilePath(this,&local_20);
    String::~String(&local_20);
    sVar2 = extraout_RDX;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(String(last_sep + 1)) : *this;
}